

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewLogger(PosixEnv *this,string *filename,Logger **result)

{
  long lVar1;
  int __fd;
  FILE *pFVar2;
  undefined8 *puVar3;
  int *piVar4;
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __fd = open((char *)*result,0x80441,0x1a4);
  if (-1 < __fd) {
    pFVar2 = fdopen(__fd,"w");
    if (pFVar2 != (FILE *)0x0) {
      puVar3 = (undefined8 *)operator_new(0x10);
      *puVar3 = &PTR__PosixLogger_00a1b098;
      puVar3[1] = pFVar2;
      *in_RCX = puVar3;
      (this->super_Env)._vptr_Env = (_func_int **)0x0;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (Status)(char *)this;
      }
      goto LAB_00549d6b;
    }
    close(__fd);
  }
  *in_RCX = 0;
  piVar4 = __errno_location();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    PosixError((anon_unknown_1 *)this,(string *)result,*piVar4);
    return (Status)(char *)this;
  }
LAB_00549d6b:
  __stack_chk_fail();
}

Assistant:

Status NewLogger(const std::string& filename, Logger** result) override {
    int fd = ::open(filename.c_str(),
                    O_APPEND | O_WRONLY | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    std::FILE* fp = ::fdopen(fd, "w");
    if (fp == nullptr) {
      ::close(fd);
      *result = nullptr;
      return PosixError(filename, errno);
    } else {
      *result = new PosixLogger(fp);
      return Status::OK();
    }
  }